

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

void VP8TBufferInit(VP8TBuffer *b,int page_size)

{
  int local_10;
  int page_size_local;
  VP8TBuffer *b_local;
  
  b->tokens_ = (uint16_t *)0x0;
  b->pages_ = (VP8Tokens *)0x0;
  b->last_page_ = &b->pages_;
  b->left_ = 0;
  local_10 = page_size;
  if (page_size < 0x2000) {
    local_10 = 0x2000;
  }
  b->page_size_ = local_10;
  b->error_ = 0;
  return;
}

Assistant:

void VP8TBufferInit(VP8TBuffer* const b, int page_size) {
  b->tokens_ = NULL;
  b->pages_ = NULL;
  b->last_page_ = &b->pages_;
  b->left_ = 0;
  b->page_size_ = (page_size < MIN_PAGE_SIZE) ? MIN_PAGE_SIZE : page_size;
  b->error_ = 0;
}